

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

int main(void)

{
  T *__ptr;
  _Head_base<0UL,_i1_*,_false> _Var1;
  i2 *piVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  T *local_30;
  
  __ptr = (T *)operator_new(0x18);
  _Var1._M_head_impl = (i1 *)operator_new(8);
  (_Var1._M_head_impl)->_vptr_i1 = (_func_int **)&PTR__i1_00103d88;
  piVar2 = (i2 *)operator_new(8);
  piVar2->_vptr_i2 = (_func_int **)&PTR__i2_00103db0;
  (__ptr->i1_)._M_t.super___uniq_ptr_impl<i1,_std::default_delete<i1>_>._M_t.
  super__Tuple_impl<0UL,_i1_*,_std::default_delete<i1>_>.super__Head_base<0UL,_i1_*,_false>.
  _M_head_impl = _Var1._M_head_impl;
  (__ptr->i2_)._M_t.super___uniq_ptr_impl<i2,_std::default_delete<i2>_>._M_t.
  super__Tuple_impl<0UL,_i2_*,_std::default_delete<i2>_>.super__Head_base<0UL,_i2_*,_false>.
  _M_head_impl = piVar2;
  __ptr->i = 0x2a;
  local_30 = __ptr;
  lVar3 = __dynamic_cast(_Var1._M_head_impl,&i1::typeinfo,&impl1::typeinfo,0);
  if (lVar3 == 0) {
    __assert_fail("dynamic_cast<impl1*>(object->i1_.get())",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module.cpp"
                  ,0x38,"int main()");
  }
  lVar3 = __dynamic_cast(piVar2,&i2::typeinfo,&impl2::typeinfo,0);
  if (lVar3 == 0) {
    __assert_fail("dynamic_cast<impl2*>(object->i2_.get())",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module.cpp"
                  ,0x39,"int main()");
  }
  plVar4 = (long *)operator_new(8);
  *plVar4 = (long)&PTR__i1_00103d88;
  lVar3 = __dynamic_cast(plVar4,&i1::typeinfo,&impl1::typeinfo,0);
  if (lVar3 == 0) {
    __assert_fail("dynamic_cast<impl1*>(up1.get())",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module.cpp"
                  ,0x3c,"int main()");
  }
  puVar5 = (undefined8 *)operator_new(8);
  *puVar5 = &PTR__i2_00103db0;
  lVar3 = __dynamic_cast(puVar5,&i2::typeinfo,&impl2::typeinfo,0);
  if (lVar3 != 0) {
    operator_delete(puVar5,8);
    (**(code **)(*plVar4 + 8))(plVar4);
    std::default_delete<T>::operator()((default_delete<T> *)&local_30,__ptr);
    return 0;
  }
  __assert_fail("dynamic_cast<impl2*>(up2.get())",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module.cpp"
                ,0x3e,"int main()");
}

Assistant:

int main() {
  auto injector = di::make_injector(module1(), module2());
  auto object = injector.create<std::unique_ptr<T>>();
  assert(dynamic_cast<impl1*>(object->i1_.get()));
  assert(dynamic_cast<impl2*>(object->i2_.get()));
  assert(42 == object->i);
  auto up1 = injector.create<std::unique_ptr<i1>>();
  assert(dynamic_cast<impl1*>(up1.get()));
  auto up2 = injector.create<std::unique_ptr<i2>>();
  assert(dynamic_cast<impl2*>(up2.get()));
}